

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void pnga_sprs_array_row_distribution(Integer s_a,Integer iproc,Integer *lo,Integer *hi)

{
  long lVar1;
  _sparse_array *p_Var2;
  Integer IVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  p_Var2 = SPA;
  lVar7 = s_a + 1000;
  *lo = SPA[lVar7].ilo;
  IVar3 = pnga_pgroup_nodeid(p_Var2[lVar7].grp);
  p_Var2 = SPA;
  if (IVar3 == iproc) {
    *lo = SPA[lVar7].ilo;
    IVar3 = p_Var2[lVar7].ihi;
  }
  else {
    lVar1 = SPA[lVar7].idim;
    lVar7 = SPA[lVar7].nprocs;
    lVar4 = (lVar1 * iproc) / lVar7;
    lVar8 = lVar7 * lVar4;
    lVar6 = (lVar4 + -1) * lVar7;
    do {
      lVar5 = lVar8 / lVar1;
      lVar4 = lVar4 + 1;
      lVar8 = lVar8 + lVar7;
      lVar6 = lVar6 + lVar7;
    } while (lVar5 < iproc);
    do {
      lVar8 = lVar6 / lVar1;
      lVar4 = lVar4 + -1;
      lVar6 = lVar6 - lVar7;
    } while (iproc < lVar8);
    *lo = lVar4;
    lVar4 = lVar1;
    if (iproc < lVar7 + -1) {
      lVar4 = (lVar1 * (iproc + 1)) / lVar7;
      lVar8 = lVar7 * lVar4;
      lVar6 = (lVar4 + -1) * lVar7;
      do {
        lVar5 = lVar8 / lVar1;
        lVar4 = lVar4 + 1;
        lVar8 = lVar8 + lVar7;
        lVar6 = lVar6 + lVar7;
      } while (lVar5 <= iproc);
      do {
        lVar8 = lVar6 / lVar1;
        lVar4 = lVar4 + -1;
        lVar6 = lVar6 - lVar7;
      } while (iproc + 1 < lVar8);
    }
    IVar3 = lVar4 + -1;
  }
  *hi = IVar3;
  return;
}

Assistant:

void pnga_sprs_array_row_distribution(Integer s_a, Integer iproc, Integer *lo,
    Integer *hi)
{
  Integer hdl = GA_OFFSET + s_a;
  *lo = SPA[hdl].ilo;
  if (iproc == pnga_pgroup_nodeid(SPA[hdl].grp)) {
    *lo = SPA[hdl].ilo;
    *hi = SPA[hdl].ihi;
  } else {
    Integer nproc = SPA[hdl].nprocs;
    Integer idim = SPA[hdl].idim;
    *lo = (SPA[hdl].idim*iproc)/nproc;
    while (((*lo)*nproc)/idim < iproc) {
      (*lo)++;
    }
    while (((*lo)*nproc)/idim > iproc) {
      (*lo)--;
    }
    if (iproc < nproc-1) {
      (*hi) = (idim*(iproc+1))/nproc;
      while (((*hi)*nproc)/idim < iproc+1) {
        (*hi)++;
      }
      while (((*hi)*nproc)/idim > iproc+1) {
        (*hi)--;
      }
      (*hi)--;
    } else {
      *hi = idim-1;
    }
  }
}